

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpos.h
# Opt level: O0

uint32_t get_pos_slot(uint32_t pos)

{
  uint local_c;
  uint32_t pos_local;
  
  if (pos < 0x2000) {
    local_c = (uint)""[pos];
  }
  else if (pos < 0x2000000) {
    local_c = ""[pos >> 0xc] + 0x18;
  }
  else {
    local_c = ""[pos >> 0x18] + 0x30;
  }
  return local_c;
}

Assistant:

static inline uint32_t
get_pos_slot(uint32_t pos)
{
	// If it is small enough, we can pick the result directly from
	// the precalculated table.
	if (pos < fastpos_limit(0, 0))
		return lzma_fastpos[pos];

	if (pos < fastpos_limit(0, 1))
		return fastpos_result(pos, 0, 1);

	return fastpos_result(pos, 0, 2);
}